

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
::solver_inequalities_101coeff
          (solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  value_bit_array<_1,_1> *this_00;
  pointer pmVar1;
  uint size;
  pointer pfVar2;
  unsigned_long *puVar3;
  byte bVar4;
  bool bVar5;
  int *piVar6;
  float *pfVar7;
  ulong uVar8;
  rc_data *__s;
  bound_factor *pbVar9;
  pointer pmVar10;
  undefined8 extraout_RAX;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar16;
  ulong uVar17;
  int iVar18;
  void *pvVar19;
  pointer pfVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  pvVar16 = csts;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  size = (this->ap).m_rows_values.m_length;
  uVar8 = (ulong)size * 4;
  pfVar7 = (float *)operator_new__(uVar8);
  memset(pfVar7,0,uVar8);
  (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar7;
  this_00 = &this->A;
  bit_array_impl::bit_array_impl(&this_00->super_bit_array_impl,size);
  pmVar10 = (csts->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar10;
  uVar8 = (long)*(pointer *)
                 ((long)&(pmVar10->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl + 8) -
          *(long *)&(pmVar10->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl >> 3;
  if (lVar15 != 0x28) {
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar26 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar27 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar28 = vpbroadcastq_avx512f();
    uVar8 = 0;
    auVar29 = vpbroadcastq_avx512f();
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vmovdqa64_avx512f(auVar28);
      vpmullq_avx512dq(auVar24,auVar26);
      uVar8 = uVar8 + 8;
      auVar24 = vpaddq_avx512f(auVar24,auVar27);
      auVar28 = vporq_avx512f(auVar30,auVar25);
      uVar17 = vpcmpuq_avx512f(auVar28,auVar29,2);
      auVar28 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar10->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar16));
      bVar4 = (byte)uVar17;
      auVar30._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * auVar28._8_8_;
      auVar30._0_8_ = (ulong)(bVar4 & 1) * auVar28._0_8_;
      auVar30._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * auVar28._16_8_;
      auVar30._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * auVar28._24_8_;
      auVar30._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * auVar28._32_8_;
      auVar30._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * auVar28._40_8_;
      auVar30._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * auVar28._48_8_;
      auVar30._56_8_ = (uVar17 >> 7) * auVar28._56_8_;
      auVar28 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar16->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar10->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar32._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * auVar28._8_8_;
      auVar32._0_8_ = (ulong)(bVar4 & 1) * auVar28._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * auVar28._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * auVar28._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * auVar28._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * auVar28._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * auVar28._48_8_;
      auVar32._56_8_ = (uVar17 >> 7) * auVar28._56_8_;
      auVar28 = vpsubq_avx512f(auVar30,auVar32);
      auVar28 = vpsraq_avx512f(auVar28,3);
      auVar28 = vpmaxuq_avx512f(auVar31,auVar28);
    } while (((lVar15 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar8);
    auVar24 = vmovdqa64_avx512f(auVar28);
    auVar25._0_8_ = (ulong)(bVar4 & 1) * auVar24._0_8_ | (ulong)!(bool)(bVar4 & 1) * auVar31._0_8_;
    bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar25._8_8_ = (ulong)bVar5 * auVar24._8_8_ | (ulong)!bVar5 * auVar31._8_8_;
    bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar25._16_8_ = (ulong)bVar5 * auVar24._16_8_ | (ulong)!bVar5 * auVar31._16_8_;
    bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar25._24_8_ = (ulong)bVar5 * auVar24._24_8_ | (ulong)!bVar5 * auVar31._24_8_;
    bVar5 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar25._32_8_ = (ulong)bVar5 * auVar24._32_8_ | (ulong)!bVar5 * auVar31._32_8_;
    bVar5 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar25._40_8_ = (ulong)bVar5 * auVar24._40_8_ | (ulong)!bVar5 * auVar31._40_8_;
    bVar5 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar25._48_8_ = (ulong)bVar5 * auVar24._48_8_ | (ulong)!bVar5 * auVar31._48_8_;
    auVar25._56_8_ = (uVar17 >> 7) * auVar24._56_8_ | (ulong)!SUB81(uVar17 >> 7,0) * auVar31._56_8_;
    auVar23 = vextracti64x4_avx512f(auVar25,1);
    auVar24 = vpmaxuq_avx512f(auVar25,ZEXT3264(auVar23));
    auVar21 = vpmaxuq_avx512vl(auVar24._0_16_,auVar24._16_16_);
    auVar22 = vpshufd_avx(auVar21,0xee);
    auVar22 = vpmaxuq_avx512vl(auVar21,auVar22);
    uVar8 = auVar22._0_8_;
  }
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar8;
  uVar8 = SUB168(auVar22 * ZEXT816(0xc),0);
  if (SUB168(auVar22 * ZEXT816(0xc),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  __s = (rc_data *)operator_new__(uVar8);
  memset(__s,0,uVar8);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
  ._M_head_impl = __s;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (long)m_;
  uVar8 = SUB168(auVar21 * ZEXT816(0xc),0);
  if (SUB168(auVar21 * ZEXT816(0xc),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pbVar9 = (bound_factor *)operator_new__(uVar8);
  memset(pbVar9,0,uVar8);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_false>
  ._M_head_impl = pbVar9;
  uVar8 = 0xffffffffffffffff;
  if (-1 < m_) {
    uVar8 = (long)m_ << 2;
  }
  pfVar7 = (float *)operator_new__(uVar8);
  pvVar19 = (void *)0x0;
  memset(pfVar7,0,uVar8);
  (this->pi)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar7;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  pmVar10 = (csts->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar10 >> 3) *
          -0x3333333333333333;
  if ((int)uVar8 != 0) {
    uVar17 = 0;
    do {
      pfVar20 = *(pointer *)
                 &pmVar10[uVar17].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar2 = *(pointer *)
                ((long)&pmVar10[uVar17].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar20 == pfVar2) {
        uVar12 = 0;
        iVar13 = 0;
      }
      else {
        iVar13 = 0;
        uVar12 = 0;
        do {
          if ((pfVar20->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_inequalities_101coeff();
            goto LAB_004417d2;
          }
          iVar18 = (int)pvVar19;
          if (pfVar20->factor < 1) {
            bit_array_impl::unset(&this_00->super_bit_array_impl,iVar18);
          }
          else {
            bit_array_impl::set(&this_00->super_bit_array_impl,iVar18);
          }
          pvVar19 = (void *)(ulong)(iVar18 + 1);
          piVar6 = &pfVar20->factor;
          pfVar20 = pfVar20 + 1;
          uVar12 = (ulong)((int)uVar12 + (uint)(0 < *piVar6));
          iVar13 = iVar13 + (uint)(*piVar6 < 1);
        } while (pfVar20 != pfVar2);
        pmVar10 = (csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      pmVar1 = pmVar10 + uVar17;
      iVar18 = pmVar1->min;
      iVar11 = (int)uVar12;
      if (iVar18 == pmVar1->max) {
        pbVar9 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_false>
                 ._M_head_impl;
        pbVar9[uVar17].min = iVar18;
        pbVar9[uVar17].max = iVar18;
        pbVar9[uVar17].negative_factor = iVar13;
      }
      else {
        iVar14 = -iVar13;
        if (iVar18 != iVar14 && SBORROW4(iVar18,iVar14) == iVar18 + iVar13 < 0) {
          iVar14 = iVar18;
        }
        pbVar9 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_false>
                 ._M_head_impl;
        pbVar9[uVar17].min = iVar14;
        iVar18 = pmVar1->max;
        if (iVar11 <= pmVar1->max) {
          iVar18 = iVar11;
        }
        pbVar9[uVar17].max = iVar18;
        pbVar9[uVar17].negative_factor = iVar13;
        if (iVar18 < iVar14) {
LAB_004417d2:
          itm::solver_inequalities_101coeff();
          goto LAB_004417d7;
        }
      }
      if (iVar13 + iVar11 !=
          (int)((ulong)((long)*(pointer *)
                               ((long)&(pmVar1->elements).
                                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                       ._M_impl + 8) -
                       *(long *)&(pmVar1->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl) >> 3)) {
LAB_004417d7:
        itm::solver_inequalities_101coeff();
        operator_delete__(pvVar19);
        *(undefined8 *)(uVar12 + 0x70) = 0;
        if (*(void **)(uVar12 + 0x68) != (void *)0x0) {
          operator_delete__(*(void **)(uVar12 + 0x68));
        }
        (this->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        puVar3 = (this->A).super_bit_array_impl.m_data._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        if (puVar3 != (unsigned_long *)0x0) {
          operator_delete__(puVar3);
        }
        (this->A).super_bit_array_impl.m_data._M_t.
        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = (unsigned_long *)0x0;
        pfVar7 = (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl;
        if (pfVar7 != (float *)0x0) {
          operator_delete__(pfVar7);
        }
        (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        _Unwind_Resume(extraout_RAX);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uVar8 & 0xffffffff));
  }
  return;
}

Assistant:

solver_inequalities_101coeff(random_engine& rng_,
                                 int m_,
                                 int n_,
                                 const cost_type& c_,
                                 const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(static_cast<int>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);

                if (cst.factor > 0)
                    A.set(id++);
                else
                    A.unset(id++);

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            b[i].negative_factor = lower;

            bx_ensures(b[i].min <= b[i].max);
            bx_ensures(upper + lower == length(csts[i].elements));
        }
    }